

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool wallet::LoadKey(CWallet *pwallet,DataStream *ssKey,DataStream *ssValue,string *strErr)

{
  bool bVar1;
  bool bVar2;
  LegacyDataSPKM *this;
  long lVar3;
  char *__s;
  uchar *this_00;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchKey;
  CPrivKey pkey;
  CKey key;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  base_blob<256U> local_c8;
  uint256 hash;
  CPubKey vchPubKey;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,&pwallet->cs_wallet,"pwallet->cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp"
             ,0x13e,false);
  this_00 = vchPubKey.vch;
  vchPubKey.vch[0] = 0xff;
  CPubKey::Unserialize<DataStream>((CPubKey *)this_00,ssKey);
  if (((vchPubKey.vch[0] & 0xfe) != 2) &&
     ((7 < vchPubKey.vch[0] || ((0xd0U >> (vchPubKey.vch[0] & 0x1f) & 1) == 0)))) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (strErr,"Error reading wallet database: CPubKey corrupt");
    bVar1 = false;
    goto LAB_0019852a;
  }
  key.fCompressed = false;
  key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  pkey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pkey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pkey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  Unserialize<DataStream,unsigned_char,secure_allocator<unsigned_char>>(ssValue,&pkey);
  base_blob<256U>::Unserialize<DataStream>(&hash.super_base_blob<256U>,ssValue);
  bVar1 = base_blob<256U>::IsNull(&hash.super_base_blob<256U>);
  if (bVar1) {
LAB_001984b7:
    bVar1 = CKey::Load(&key,&pkey,&vchPubKey,!bVar1);
    if (!bVar1) {
      __s = "Error reading wallet database: CPrivKey corrupt";
LAB_0019850e:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (strErr,__s);
      goto LAB_00198516;
    }
    this = CWallet::GetOrCreateLegacyDataSPKM(pwallet);
    bVar2 = LegacyDataSPKM::LoadKey(this,&key,&vchPubKey);
    bVar1 = true;
    if (!bVar2) {
      __s = "Error reading wallet database: LegacyDataSPKM::LoadKey failed";
      goto LAB_0019850e;
    }
  }
  else {
    vchKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vchKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vchKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((vchPubKey.vch[0] & 0xfe) == 2) {
      lVar3 = 0x21;
    }
    else if ((byte)(vchPubKey.vch[0] - 4) < 4) {
      lVar3 = *(long *)(&DAT_003f01e0 + (ulong)(byte)(vchPubKey.vch[0] - 4) * 8);
    }
    else {
      lVar3 = 0;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (&vchKey,(size_type)
                       (pkey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                       (lVar3 - (long)pkey.
                                      super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start)));
    if ((vchPubKey.vch[0] & 0xfe) == 2) {
      this_00 = vchPubKey.vch + 0x21;
    }
    else if ((vchPubKey.vch[0] < 8) && ((0xd0U >> (vchPubKey.vch[0] & 0x1f) & 1) != 0)) {
      this_00 = (uchar *)&local_38;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&vchKey,
               (const_iterator)
               vchKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,vchPubKey.vch,this_00);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,secure_allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&vchKey,
               (const_iterator)
               vchKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_>
                )pkey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_>
                )pkey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    Hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>((uint256 *)&local_c8,&vchKey);
    bVar2 = operator!=(&local_c8,&hash.super_base_blob<256U>);
    if (!bVar2) {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&vchKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      goto LAB_001984b7;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (strErr,"Error reading wallet database: CPubKey/CPrivKey corrupt");
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&vchKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
LAB_00198516:
    bVar1 = false;
  }
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
            (&pkey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key.keydata);
LAB_0019852a:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool LoadKey(CWallet* pwallet, DataStream& ssKey, DataStream& ssValue, std::string& strErr)
{
    LOCK(pwallet->cs_wallet);
    try {
        CPubKey vchPubKey;
        ssKey >> vchPubKey;
        if (!vchPubKey.IsValid())
        {
            strErr = "Error reading wallet database: CPubKey corrupt";
            return false;
        }
        CKey key;
        CPrivKey pkey;
        uint256 hash;

        ssValue >> pkey;

        // Old wallets store keys as DBKeys::KEY [pubkey] => [privkey]
        // ... which was slow for wallets with lots of keys, because the public key is re-derived from the private key
        // using EC operations as a checksum.
        // Newer wallets store keys as DBKeys::KEY [pubkey] => [privkey][hash(pubkey,privkey)], which is much faster while
        // remaining backwards-compatible.
        try
        {
            ssValue >> hash;
        }
        catch (const std::ios_base::failure&) {}

        bool fSkipCheck = false;

        if (!hash.IsNull())
        {
            // hash pubkey/privkey to accelerate wallet load
            std::vector<unsigned char> vchKey;
            vchKey.reserve(vchPubKey.size() + pkey.size());
            vchKey.insert(vchKey.end(), vchPubKey.begin(), vchPubKey.end());
            vchKey.insert(vchKey.end(), pkey.begin(), pkey.end());

            if (Hash(vchKey) != hash)
            {
                strErr = "Error reading wallet database: CPubKey/CPrivKey corrupt";
                return false;
            }

            fSkipCheck = true;
        }

        if (!key.Load(pkey, vchPubKey, fSkipCheck))
        {
            strErr = "Error reading wallet database: CPrivKey corrupt";
            return false;
        }
        if (!pwallet->GetOrCreateLegacyDataSPKM()->LoadKey(key, vchPubKey))
        {
            strErr = "Error reading wallet database: LegacyDataSPKM::LoadKey failed";
            return false;
        }
    } catch (const std::exception& e) {
        if (strErr.empty()) {
            strErr = e.what();
        }
        return false;
    }
    return true;
}